

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHash.c
# Opt level: O2

HashReturn Keccak_HashFinal(Keccak_HashInstance *instance,BitSequence *hashval)

{
  HashReturn HVar1;
  
  HVar1 = KeccakWidth1600_SpongeAbsorbLastFewBits(&instance->sponge,instance->delimitedSuffix);
  if (HVar1 != SUCCESS) {
    return HVar1;
  }
  HVar1 = KeccakWidth1600_SpongeSqueeze
                    (&instance->sponge,hashval,(ulong)(instance->fixedOutputLength >> 3));
  return HVar1;
}

Assistant:

HashReturn Keccak_HashFinal(Keccak_HashInstance *instance,
                            BitSequence *hashval) {
  HashReturn ret = (HashReturn)KeccakWidth1600_SpongeAbsorbLastFewBits(
      &instance->sponge, instance->delimitedSuffix);
  if (ret == SUCCESS)
    return (HashReturn)KeccakWidth1600_SpongeSqueeze(
        &instance->sponge, hashval, instance->fixedOutputLength / 8);
  else
    return ret;
}